

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void __thiscall
wasm::FunctionValidator::validateAlignment
          (FunctionValidator *this,size_t align,Type type,Index bytes,bool isAtomic,Expression *curr
          )

{
  ValidationInfo *this_00;
  char cVar1;
  bool bVar2;
  long *plVar3;
  size_t sVar4;
  size_type *psVar5;
  char cVar6;
  char *__assertion;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  size_type *local_60;
  string __str;
  Type type_local;
  
  __str.field_2._8_8_ = type.id;
  if ((int)CONCAT71(in_register_00000081,isAtomic) != 0) {
    ValidationInfo::shouldBeEqual<wasm::Expression*,unsigned_long>
              (this->info,align,(ulong)bytes,curr,"atomic accesses must have natural alignment",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    return;
  }
  if ((0x10 < align) || ((0x10116UL >> (align & 0x3f) & 1) == 0)) {
    cVar6 = '\x01';
    if (9 < align) {
      sVar4 = align;
      cVar1 = '\x04';
      do {
        cVar6 = cVar1;
        if (sVar4 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_009c46f1;
        }
        if (sVar4 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_009c46f1;
        }
        if (sVar4 < 10000) goto LAB_009c46f1;
        bVar2 = 99999 < sVar4;
        sVar4 = sVar4 / 10000;
        cVar1 = cVar6 + '\x04';
      } while (bVar2);
      cVar6 = cVar6 + '\x01';
    }
LAB_009c46f1:
    this_00 = this->info;
    local_60 = &__str._M_string_length;
    std::__cxx11::string::_M_construct((ulong)&local_60,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_60,(uint)__str._M_dataplus._M_p,align);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0xbb0cd4);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_80.field_2._M_allocated_capacity = *psVar5;
      local_80.field_2._8_8_ = plVar3[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar5;
      local_80._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_80._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ValidationInfo::fail<wasm::Expression*,std::__cxx11::string>
              (this_00,&local_80,curr,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_60 != &__str._M_string_length) {
      operator_delete(local_60,__str._M_string_length + 1);
    }
  }
  ValidationInfo::shouldBeTrue<wasm::Expression*>
            (this->info,align <= bytes,curr,"alignment must not exceed natural",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  bVar2 = wasm::Type::isTuple((Type *)((long)&__str.field_2 + 8));
  if (bVar2) {
    __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
LAB_009c47de:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                  ,0xc3e,
                  "void wasm::FunctionValidator::validateAlignment(size_t, Type, Index, bool, Expression *)"
                 );
  }
  if (6 < (ulong)__str.field_2._8_8_) {
    __assertion = "type.isBasic() && \"TODO: handle compound types\"";
    goto LAB_009c47de;
  }
  switch(__str.field_2._8_8_ & 0xffffffff) {
  case 0:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                       ,0xc4e);
  default:
    goto switchD_009c4657_caseD_1;
  case 2:
  case 4:
    bVar2 = align < 5;
    break;
  case 3:
  case 5:
    bVar2 = align < 9;
  }
  ValidationInfo::shouldBeTrue<wasm::Expression*>
            (this->info,bVar2,curr,"alignment must not exceed natural",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
switchD_009c4657_caseD_1:
  return;
}

Assistant:

void FunctionValidator::validateAlignment(
  size_t align, Type type, Index bytes, bool isAtomic, Expression* curr) {
  if (isAtomic) {
    shouldBeEqual(align,
                  (size_t)bytes,
                  curr,
                  "atomic accesses must have natural alignment");
    return;
  }
  switch (align) {
    case 1:
    case 2:
    case 4:
    case 8:
    case 16:
      break;
    default: {
      info.fail("bad alignment: " + std::to_string(align), curr, getFunction());
      break;
    }
  }
  shouldBeTrue(align <= bytes, curr, "alignment must not exceed natural");
  TODO_SINGLE_COMPOUND(type);
  switch (type.getBasic()) {
    case Type::i32:
    case Type::f32: {
      shouldBeTrue(align <= 4, curr, "alignment must not exceed natural");
      break;
    }
    case Type::i64:
    case Type::f64: {
      shouldBeTrue(align <= 8, curr, "alignment must not exceed natural");
      break;
    }
    case Type::v128:
    case Type::unreachable:
      break;
    case Type::none:
      WASM_UNREACHABLE("invalid type");
  }
}